

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkNode
          (FunctionReturnTypeEvaluator *this,Statement *n)

{
  byte *pbVar1;
  bool bVar2;
  
  bVar2 = false;
  switch((n->super_Node)._op) {
  case TO_BLOCK:
    bVar2 = checkBlock(this,(Block *)n);
    return bVar2;
  case TO_IF:
    bVar2 = checkIf(this,(IfStatement *)n);
    return bVar2;
  case TO_WHILE:
  case TO_DOWHILE:
  case TO_FOR:
  case TO_FOREACH:
    checkLoop(this,(LoopStatement *)n);
    return false;
  case TO_SWITCH:
    bVar2 = checkSwitch(this,(SwitchStatement *)n);
    return bVar2;
  case TO_RETURN:
    checkReturn(this,(ReturnStatement *)n);
    break;
  default:
    goto switchD_0014294a_caseD_8;
  case TO_THROW:
    pbVar1 = (byte *)((long)&this->flags + 1);
    *pbVar1 = *pbVar1 | 4;
    break;
  case TO_TRY:
    bVar2 = checkTry(this,(TryStatement *)n);
    return bVar2;
  }
  bVar2 = true;
switchD_0014294a_caseD_8:
  return bVar2;
}

Assistant:

bool FunctionReturnTypeEvaluator::checkNode(const Statement *n) {
  switch (n->op())
  {
  case TO_RETURN: return checkReturn(static_cast<const ReturnStatement *>(n));
  case TO_THROW: return checkThrow(static_cast<const ThrowStatement *>(n));
  case TO_FOR: case TO_FOREACH: case TO_WHILE: case TO_DOWHILE:
    return checkLoop(static_cast<const LoopStatement *>(n));
  case TO_IF: return checkIf(static_cast<const IfStatement *>(n));
  case TO_SWITCH: return checkSwitch(static_cast<const SwitchStatement *>(n));
  case TO_BLOCK: return checkBlock(static_cast<const Block *>(n));
  case TO_TRY: return checkTry(static_cast<const TryStatement *>(n));
  default:
    return false;
  }
}